

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O3

void __thiscall
HighsHashTree<std::pair<int,_int>,_double>::InnerLeaf<4>::rehash(InnerLeaf<4> *this,int hashPos)

{
  double dVar1;
  unsigned_long uVar2;
  pair<int,_int> pVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  uint64_t hash;
  ulong uVar9;
  ulong uVar10;
  int pos;
  int i;
  int local_40;
  int local_3c;
  double local_38;
  
  (this->occupation).occupation = 0;
  iVar5 = this->size;
  uVar4 = (ulong)iVar5;
  if (0 < (long)uVar4) {
    lVar6 = 0;
    uVar8 = 0;
    do {
      uVar9 = *(ulong *)((long)&(this->entries)._M_elems[0].key_.first + lVar6 * 2);
      uVar10 = uVar9 & 0xffffffff;
      uVar9 = uVar9 >> 0x20;
      uVar9 = ((uVar9 + 0x80c8963be3e4c2f3) * (uVar10 + 0xc8497d2a400d9551) >> 0x20 ^
              (uVar9 + 0x8a183895eeac1536) * (uVar10 + 0x42d8680e260ae5b)) >>
              ((char)hashPos * -6 + 0x30U & 0x3f);
      *(ulong *)((long)(this->hashes)._M_elems + lVar6) = uVar9 & 0xffff;
      uVar8 = uVar8 | 1L << (uVar9 >> 10 & 0x3f);
      lVar6 = lVar6 + 8;
    } while (uVar4 << 3 != lVar6);
    (this->occupation).occupation = uVar8;
    local_3c = 0;
    if (0 < iVar5) {
      iVar5 = 0;
      do {
        lVar7 = (long)iVar5;
        uVar8 = (this->hashes)._M_elems[lVar7];
        lVar6 = POPCOUNT((this->occupation).occupation >> ((byte)(uVar8 >> 10) & 0x3f));
        local_40 = (int)lVar6 + -1;
        if (iVar5 < local_40) {
          uVar2 = (this->hashes)._M_elems[local_40];
          (this->hashes)._M_elems[local_40] = uVar8;
          (this->hashes)._M_elems[lVar7] = uVar2;
          dVar1 = (this->entries)._M_elems[local_40].value_;
          (this->entries)._M_elems[local_40].value_ = (this->entries)._M_elems[lVar7].value_;
          pVar3 = (this->entries)._M_elems[local_40].key_;
          (this->entries)._M_elems[local_40].key_ = (this->entries)._M_elems[lVar7].key_;
          (this->entries)._M_elems[lVar7].key_ = pVar3;
          (this->entries)._M_elems[lVar7].value_ = dVar1;
        }
        else {
          if ((int)lVar6 <= iVar5) {
            do {
              if ((this->hashes)._M_elems[lVar6 + -1] < uVar8) {
                local_38 = (this->entries)._M_elems[lVar7].value_;
                pVar3 = (this->entries)._M_elems[lVar7].key_;
                move_backward(this,&local_40,&local_3c);
                lVar6 = (long)local_40;
                (this->hashes)._M_elems[lVar6] = uVar8;
                (this->entries)._M_elems[lVar6].key_ = pVar3;
                (this->entries)._M_elems[lVar6].value_ = local_38;
                uVar4 = (ulong)(uint)this->size;
                iVar5 = local_3c;
                break;
              }
              local_40 = (int)lVar6;
              lVar6 = lVar6 + 1;
            } while (lVar7 + 1 != lVar6);
          }
          iVar5 = iVar5 + 1;
          local_3c = iVar5;
        }
      } while (iVar5 < (int)uVar4);
    }
  }
  return;
}

Assistant:

void rehash(int hashPos) {
      // function needs to possibly reorder elements by a different hash value
      // chances are very high we are already ordered correctly as we use 16
      // bits of the hash and one level is uses 6 bits, so the new values
      // are guaranteed to be ordered correctly by their 10 most significant
      // bits if increasing the hash position by 1 and only if the 10 bits of
      // the hash had a collision the new 6 bits might break a tie differently.
      // It is, however, important to maintain the exact ordering as otherwise
      // elements may not be found.
      occupation = 0;
      for (int i = 0; i < size; ++i) {
        hashes[i] = get_hash_chunks16(compute_hash(entries[i].key()), hashPos);
        occupation.set(get_first_chunk16(hashes[i]));
      }

      int i = 0;
      while (i < size) {
        uint8_t hashChunk = get_first_chunk16(hashes[i]);
        int pos = occupation.num_set_until(hashChunk) - 1;

        // if the position is after i the element definitely comes later, so we
        // swap it to that position and proceed without increasing i until
        // eventually an element appears that comes at position i or before
        if (pos > i) {
          std::swap(hashes[pos], hashes[i]);
          std::swap(entries[pos], entries[i]);
          continue;
        }

        // the position is before or at i, now check where the exact location
        // should be for the ordering by hash so that the invariant is that all
        // elements up to i are properly sorted. Essentially insertion sort but
        // with the modification of having a high chance to guess the correct
        // position already using the occupation flags.
        while (pos < i && hashes[pos] >= hashes[i]) ++pos;

        // if the final position is before i we need to move elements to
        // make space at that position, otherwise nothing needs to be done but
        // incrementing i increasing the sorted range by 1.
        if (pos < i) {
          uint64_t hash = hashes[i];
          auto entry = std::move(entries[i]);
          move_backward(pos, i);
          hashes[pos] = hash;
          entries[pos] = std::move(entry);
        }
        ++i;
      }
    }